

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

Result tonk::SecureRandom_Next(uint8_t *key,uint bytes)

{
  string *desc;
  ErrorResult *in_RDI;
  int cymricResult;
  Locker locker;
  int in_stack_000000f4;
  void *in_stack_000000f8;
  cymric_rng *in_stack_00000100;
  Lock *in_stack_ffffffffffffff28;
  Locker *in_stack_ffffffffffffff30;
  ErrorResult *pEVar1;
  allocator *source;
  ErrorResult *this;
  allocator local_91;
  string local_90 [52];
  int local_5c;
  long local_28;
  undefined4 local_1c;
  string *local_18;
  char *local_10;
  
  pEVar1 = in_RDI;
  Locker::Locker(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_5c = cymric_random(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  if (local_5c == 0) {
    Result::Success();
  }
  else {
    source = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"cymric_random failed",source);
    local_28 = (long)local_5c;
    local_10 = "SecureRandom_Next";
    local_18 = local_90;
    local_1c = 3;
    this = pEVar1;
    desc = (string *)operator_new(0x38);
    ErrorResult::ErrorResult
              (this,(char *)source,desc,(ErrorType)((ulong)pEVar1 >> 0x20),
               (ErrorCodeT)in_stack_ffffffffffffff30);
    pEVar1->Source = (char *)desc;
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  Locker::~Locker((Locker *)0x187e4e);
  return (Result)in_RDI;
}

Assistant:

Result SecureRandom_Next(uint8_t* key, unsigned bytes)
{
    Locker locker(PrngLock);
    TONK_DEBUG_ASSERT(PrngInitialized);

    int cymricResult = cymric_random(&Prng, key, static_cast<int>(bytes));
    if (0 != cymricResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("SecureRandom_Next", "cymric_random failed", ErrorType::Cymric, cymricResult);
    }

    return Result::Success();
}